

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O3

void __thiscall
basist::decoder_etc_block::get_block_colors
          (decoder_etc_block *this,color32 *pBlock_colors,uint32_t subblock_index)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  ulong uVar8;
  uint8_t uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  anon_union_4_3_898e29d3_for_color32_0 local_1c;
  
  bVar7 = (this->field_0).m_bytes[3];
  bVar3 = (this->field_0).m_bytes[0];
  bVar5 = (this->field_0).m_bytes[1];
  if ((bVar7 & 2) == 0) {
    if (subblock_index == 0) {
      bVar3 = bVar3 >> 4;
      bVar5 = bVar5 >> 4;
      bVar7 = (this->field_0).m_bytes[2] >> 4;
    }
    else {
      bVar3 = bVar3 & 0xf;
      bVar5 = bVar5 & 0xf;
      bVar7 = (this->field_0).m_bytes[2] & 0xf;
    }
    bVar7 = bVar5 << 4 | bVar7;
    local_1c.m = (bVar7 & 0xfffffff0 | (uint)bVar5) << 8 |
                 (bVar7 & 0xf) << 0x10 | (uint)bVar7 << 0x14 | (uint)bVar3 << 4 | (uint)bVar3 |
                 0xff000000;
  }
  else {
    bVar1 = bVar5 >> 3;
    bVar2 = (this->field_0).m_bytes[2] >> 3;
    if (subblock_index == 0) {
      local_1c.field_0.r = bVar3 >> 5 | bVar3 & 0xf8;
      local_1c.field_0.b =
           (byte)(((uint)bVar2 << 0xe) >> 0x10) | (byte)(((uint)bVar2 << 0x13) >> 0x10);
      local_1c.field_0.g = (byte)(((uint)bVar1 << 6) >> 8) | (byte)(((uint)bVar1 << 0xb) >> 8);
      goto LAB_0013bf9f;
    }
    unpack_color5((color32 *)&local_1c.field_0,
                  (ushort)((bVar3 & 0xf8) << 7) | (ushort)bVar2 | (ushort)bVar1 << 5,
                  (ushort)((bVar3 & 7) << 6) | ((this->field_0).m_bytes[2] & 7) + (bVar5 & 7) * 8,
                  true,0xff);
  }
  if (1 < subblock_index) {
    __assert_fail("subblock_id < 2",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/transcoder/basisu_transcoder.cpp"
                  ,0x24a,"uint32_t basist::decoder_etc_block::get_inten_table(uint32_t) const");
  }
  bVar7 = (this->field_0).m_bytes[3];
LAB_0013bf9f:
  uVar8 = (ulong)((bVar7 >> (subblock_index == 0) * '\x03' + 2 & 7) << 4);
  uVar4 = (uint)local_1c.field_0.r;
  iVar13 = *(int *)((long)&g_etc1_inten_tables + uVar8);
  iVar6 = 0;
  iVar10 = iVar13 + uVar4;
  if ((int)(iVar13 + uVar4) < 1) {
    iVar10 = iVar6;
  }
  uVar9 = (uint8_t)iVar10;
  if (0xfe < iVar10) {
    uVar9 = 0xff;
  }
  uVar12 = (uint)local_1c.field_0.g;
  iVar10 = iVar13 + uVar12;
  if ((int)(iVar13 + uVar12) < 1) {
    iVar10 = iVar6;
  }
  if (0xfe < iVar10) {
    iVar10 = 0xff;
  }
  iVar13 = iVar13 + (uint)local_1c.field_0.b;
  if (iVar13 < 1) {
    iVar13 = iVar6;
  }
  if (0xfe < iVar13) {
    iVar13 = 0xff;
  }
  iVar14 = *(int *)((long)&DAT_001e5b34 + uVar8);
  (pBlock_colors->field_0).field_0.r = uVar9;
  (pBlock_colors->field_0).field_0.g = (uint8_t)iVar10;
  (pBlock_colors->field_0).field_0.b = (uint8_t)iVar13;
  iVar13 = iVar14 + uVar4;
  if ((int)(iVar14 + uVar4) < 1) {
    iVar13 = iVar6;
  }
  if (0xfe < iVar13) {
    iVar13 = 0xff;
  }
  iVar10 = iVar14 + uVar12;
  if ((int)(iVar14 + uVar12) < 1) {
    iVar10 = iVar6;
  }
  (pBlock_colors->field_0).field_0.a = 0xff;
  iVar11 = 0xff;
  if (0xfe < iVar10) {
    iVar10 = iVar11;
  }
  iVar14 = iVar14 + (uint)local_1c.field_0.b;
  if (iVar14 < 1) {
    iVar14 = iVar6;
  }
  if (0xfe < iVar14) {
    iVar14 = iVar11;
  }
  pBlock_colors[1].field_0.field_0.r = (uint8_t)iVar13;
  pBlock_colors[1].field_0.field_0.g = (uint8_t)iVar10;
  pBlock_colors[1].field_0.field_0.b = (uint8_t)iVar14;
  pBlock_colors[1].field_0.field_0.a = 0xff;
  iVar13 = *(int *)((long)&DAT_001e5b38 + uVar8);
  iVar10 = iVar13 + uVar4;
  if ((int)(iVar13 + uVar4) < 1) {
    iVar10 = iVar6;
  }
  if (0xfe < iVar10) {
    iVar10 = iVar11;
  }
  iVar14 = iVar13 + uVar12;
  if ((int)(iVar13 + uVar12) < 1) {
    iVar14 = iVar6;
  }
  if (0xfe < iVar14) {
    iVar14 = iVar11;
  }
  iVar13 = iVar13 + (uint)local_1c.field_0.b;
  if (iVar13 < 1) {
    iVar13 = iVar6;
  }
  if (0xfe < iVar13) {
    iVar13 = iVar11;
  }
  pBlock_colors[2].field_0.field_0.r = (uint8_t)iVar10;
  pBlock_colors[2].field_0.field_0.g = (uint8_t)iVar14;
  pBlock_colors[2].field_0.field_0.b = (uint8_t)iVar13;
  pBlock_colors[2].field_0.field_0.a = 0xff;
  iVar13 = *(int *)((long)&DAT_001e5b3c + uVar8);
  iVar10 = uVar4 + iVar13;
  if ((int)(uVar4 + iVar13) < 1) {
    iVar10 = iVar6;
  }
  if (0xfe < iVar10) {
    iVar10 = iVar11;
  }
  iVar14 = uVar12 + iVar13;
  if ((int)(uVar12 + iVar13) < 1) {
    iVar14 = iVar6;
  }
  if (0xfe < iVar14) {
    iVar14 = 0xff;
  }
  iVar13 = iVar13 + (uint)local_1c.field_0.b;
  if (iVar13 < 1) {
    iVar13 = iVar6;
  }
  if (0xfe < iVar13) {
    iVar13 = 0xff;
  }
  pBlock_colors[3].field_0.field_0.r = (uint8_t)iVar10;
  pBlock_colors[3].field_0.field_0.g = (uint8_t)iVar14;
  pBlock_colors[3].field_0.field_0.b = (uint8_t)iVar13;
  pBlock_colors[3].field_0.field_0.a = 0xff;
  return;
}

Assistant:

void get_block_colors(color32* pBlock_colors, uint32_t subblock_index) const
		{
			color32 b;

			if (get_diff_bit())
			{
				if (subblock_index)
					unpack_color5(b, get_base5_color(), get_delta3_color(), true, 255);
				else
					unpack_color5(b, get_base5_color(), true);
			}
			else
			{
				b = unpack_color4(get_base4_color(subblock_index), true, 255);
			}

			const int* pInten_table = g_etc1_inten_tables[get_inten_table(subblock_index)];

			pBlock_colors[0].set_noclamp_rgba(clamp255(b.r + pInten_table[0]), clamp255(b.g + pInten_table[0]), clamp255(b.b + pInten_table[0]), 255);
			pBlock_colors[1].set_noclamp_rgba(clamp255(b.r + pInten_table[1]), clamp255(b.g + pInten_table[1]), clamp255(b.b + pInten_table[1]), 255);
			pBlock_colors[2].set_noclamp_rgba(clamp255(b.r + pInten_table[2]), clamp255(b.g + pInten_table[2]), clamp255(b.b + pInten_table[2]), 255);
			pBlock_colors[3].set_noclamp_rgba(clamp255(b.r + pInten_table[3]), clamp255(b.g + pInten_table[3]), clamp255(b.b + pInten_table[3]), 255);
		}